

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  ImGuiTableSettings *p;
  ImGuiTableColumn *pIVar5;
  ImGuiTableSettings *pIVar6;
  int n;
  int iVar7;
  byte bVar8;
  byte bVar9;
  float fVar10;
  
  table->IsSettingsDirty = false;
  pIVar2 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  p = TableGetBoundSettings(table);
  if (p == (ImGuiTableSettings *)0x0) {
    p = TableSettingsCreate(table->ID,table->ColumnsCount);
    iVar4 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar2->SettingsTables,p);
    table->SettingsOffset = iVar4;
  }
  iVar4 = table->ColumnsCount;
  p->ColumnsCount = (char)iVar4;
  if (p->ID == table->ID) {
    if (((char)iVar4 == iVar4) && (iVar4 <= p->ColumnsCountMax)) {
      pIVar5 = (table->Columns).Data;
      p->SaveFlags = 0;
      pIVar6 = p + 1;
      bVar3 = false;
      for (iVar7 = 0; iVar7 < iVar4; iVar7 = iVar7 + 1) {
        fVar10 = *(float *)((long)&pIVar5->WidthRequest + (ulong)(pIVar5->Flags & 8));
        pIVar6->ID = (ImGuiID)fVar10;
        *(char *)&pIVar6->RefScale = (char)iVar7;
        *(ImGuiTableColumnIdx *)((long)&pIVar6->RefScale + 1) = pIVar5->DisplayOrder;
        *(ImGuiTableColumnIdx *)((long)&pIVar6->RefScale + 2) = pIVar5->SortOrder;
        bVar8 = pIVar5->field_0x65 & 3;
        bVar9 = *(byte *)((long)&pIVar6->RefScale + 3);
        *(byte *)((long)&pIVar6->RefScale + 3) = bVar9 & 0xfc | bVar8;
        bVar9 = bVar9 & 0xf8 | bVar8 | pIVar5->IsUserEnabled << 2;
        *(byte *)((long)&pIVar6->RefScale + 3) = bVar9;
        *(byte *)((long)&pIVar6->RefScale + 3) = bVar9 & 0xf7 | (byte)pIVar5->Flags & 8;
        uVar1 = pIVar5->Flags;
        if ((fVar10 != pIVar5->InitStretchWeightOrWidth) ||
           (NAN(fVar10) || NAN(pIVar5->InitStretchWeightOrWidth))) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 1;
        }
        if (iVar7 != pIVar5->DisplayOrder) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 2;
        }
        if (pIVar5->SortOrder != -1) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 8;
        }
        if ((uVar1 >> 1 & 1) == (uint)pIVar5->IsUserEnabled) {
          *(byte *)&p->SaveFlags = (byte)p->SaveFlags | 4;
        }
        bVar3 = (bool)(bVar3 | (uVar1 & 8) == 0);
        pIVar5 = pIVar5 + 1;
        pIVar6 = (ImGuiTableSettings *)&pIVar6->ColumnsCount;
        iVar4 = table->ColumnsCount;
      }
      p->SaveFlags = p->SaveFlags & table->Flags;
      fVar10 = 0.0;
      if (bVar3) {
        fVar10 = table->RefScale;
      }
      p->RefScale = fVar10;
      MarkIniSettingsDirty();
      return;
    }
    __assert_fail("settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                  ,0xc9b,"void ImGui::TableSaveSettings(ImGuiTable *)");
  }
  __assert_fail("settings->ID == table->ID",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui_tables.cpp"
                ,0xc9a,"void ImGui::TableSaveSettings(ImGuiTable *)");
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}